

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O0

void gl4cts::MultiBind::checkVertexAttribBinding(Context *context,GLuint index,GLint expected_value)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this;
  TestLog *this_00;
  MessageBuilder *pMVar3;
  TestError *this_01;
  MessageBuilder local_1a8;
  int local_24;
  long lStack_20;
  GLint binding;
  Functions *gl;
  GLint expected_value_local;
  GLuint index_local;
  Context *context_local;
  
  gl._0_4_ = expected_value;
  gl._4_4_ = index;
  _expected_value_local = context;
  pRVar2 = deqp::Context::getRenderContext(context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  local_24 = -1;
  (**(code **)(lStack_20 + 0xbe0))(gl._4_4_,0x889f,&local_24);
  err = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(err,"GetVertexAttribiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x5bf);
  if (local_24 != (GLint)gl) {
    this = deqp::Context::getTestContext(_expected_value_local);
    this_00 = tcu::TestContext::getLog(this);
    tcu::TestLog::operator<<(&local_1a8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [18])"Invalid binding: ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_24);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [13])0x2a14159);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(int *)&gl);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [27])". Target: Vertex attribute");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [12])0x2b1b76b);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(uint *)((long)&gl + 4));
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Invalid binding",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x5c6);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return;
}

Assistant:

void checkVertexAttribBinding(deqp::Context& context, GLuint index, GLint expected_value)
{
	const Functions& gl = context.getRenderContext().getFunctions();

	GLint binding = -1;

	gl.getVertexAttribiv(index, GL_VERTEX_ATTRIB_ARRAY_BUFFER_BINDING, &binding);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetVertexAttribiv");

	if (binding != expected_value)
	{
		context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid binding: " << binding
										  << ", expected: " << expected_value << ". Target: Vertex attribute"
										  << " at index: " << index << tcu::TestLog::EndMessage;
		TCU_FAIL("Invalid binding");
	}
}